

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

int __thiscall
fmt::internal::CharTraits<wchar_t>::format_float<long_double>
          (CharTraits<wchar_t> *this,wchar_t *buffer,size_t size,wchar_t *format,uint width,
          int precision,longdouble value)

{
  int iVar1;
  
  if ((int)format == 0) {
    if ((int)width < 0) {
      iVar1 = swprintf((wchar_t *)this,(size_t)buffer,(wchar_t *)size);
      return iVar1;
    }
    format = (wchar_t *)(ulong)width;
  }
  else if (-1 < (int)width) {
    iVar1 = swprintf((wchar_t *)this,(size_t)buffer,(wchar_t *)size);
    return iVar1;
  }
  iVar1 = swprintf((wchar_t *)this,(size_t)buffer,(wchar_t *)size,format,width,precision,value);
  return iVar1;
}

Assistant:

int fmt::internal::CharTraits<wchar_t>::format_float(
    wchar_t *buffer, std::size_t size, const wchar_t *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SWPRINTF(buffer, size, format, value) :
        FMT_SWPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SWPRINTF(buffer, size, format, width, value) :
      FMT_SWPRINTF(buffer, size, format, width, precision, value);
}